

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsChecker.cpp
# Opt level: O0

bool __thiscall DatUnpacker::ArgumentsChecker::checkSource(ArgumentsChecker *this,string *source)

{
  bool bVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  path local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *source_local;
  ArgumentsChecker *this_local;
  
  local_20 = source;
  source_local = &this->_errorMessage;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 == 0) {
    std::__cxx11::string::operator=((string *)this,"Path to DAT file not specified");
    this_local._7_1_ = false;
  }
  else {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_48,local_20,auto_format);
    bVar1 = std::filesystem::is_regular_file(&local_48);
    std::filesystem::__cxx11::path::~path(&local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local._7_1_ = true;
    }
    else {
      std::operator+(&local_78,"DAT file not found: ",local_20);
      std::__cxx11::string::operator=((string *)this,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ArgumentsChecker::checkSource(const std::string& source) {
        if (source.length() == 0) {
            _errorMessage = "Path to DAT file not specified";
            return false;
        }

        if (!std::filesystem::is_regular_file(source)) {
            _errorMessage = "DAT file not found: " + source;
            return false;
        }

        return true;
    }